

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

CRef __thiscall Minisat::Solver::propagate(Solver *this)

{
  uint *puVar1;
  byte bVar2;
  uint uVar3;
  lbool *plVar4;
  Watcher WVar5;
  int iVar6;
  Watcher WVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  byte bVar11;
  ulong uVar12;
  Watcher *pWVar13;
  Watcher *pWVar14;
  Watcher *pWVar15;
  Watcher *pWVar16;
  bool bVar17;
  bool bVar18;
  Lit p;
  Watcher w;
  CRef local_78;
  Lit local_74;
  Solver *local_70;
  Watcher local_68;
  uint local_5c;
  uint local_58;
  Lit local_54;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
  *local_50;
  Watcher *local_48;
  vec<Minisat::Solver::Watcher,_int> *local_40;
  ulong local_38;
  
  iVar6 = this->qhead;
  uVar8 = 0;
  if (iVar6 < (this->trail).sz) {
    local_50 = &this->watches;
    local_78 = 0xffffffff;
    uVar10 = 0;
    local_70 = this;
    do {
      this->qhead = iVar6 + 1;
      local_74.x = (this->trail).data[iVar6].x;
      local_5c = uVar10;
      local_40 = OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
                 ::lookup(local_50,&local_74);
      pWVar15 = local_40->data;
      pWVar16 = pWVar15;
      if ((long)local_40->sz != 0) {
        pWVar13 = pWVar15 + local_40->sz;
        pWVar14 = pWVar15;
        local_48 = pWVar13;
        do {
          bVar2 = l_True;
          uVar10 = (pWVar14->blocker).x;
          if ((this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.
              sz <= (int)uVar10 >> 1) goto LAB_0010a4b8;
          plVar4 = (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.
                   map.data;
          bVar11 = l_True & 2;
          if ((((byte)uVar10 & 1 ^ plVar4[(int)uVar10 >> 1].value) != l_True || bVar11 != 0) &&
              (plVar4[(int)uVar10 >> 1].value & bVar11) == 0) {
            uVar3 = pWVar14->cref;
            uVar8 = (ulong)uVar3;
            if ((this->ca).ra.sz <= uVar3) {
              __assert_fail("r < sz",
                            "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/mtl/Alloc.h"
                            ,0x3f,
                            "T &Minisat::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]"
                           );
            }
            puVar1 = (this->ca).ra.memory + uVar8;
            uVar9 = local_74.x ^ 1;
            if (puVar1[1] == uVar9) {
              puVar1[1] = puVar1[2];
              puVar1[2] = uVar9;
            }
            if (puVar1[2] != uVar9) {
              __assert_fail("c[1] == false_lit",
                            "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/core/Solver.cc"
                            ,0x211,"CRef Minisat::Solver::propagate()");
            }
            pWVar15 = pWVar14 + 1;
            local_68.blocker.x = puVar1[1];
            local_68.cref = uVar3;
            if (local_68.blocker.x != uVar10) {
              if ((this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.
                  map.sz <= local_68.blocker.x >> 1) goto LAB_0010a4b8;
              if (((byte)local_68.blocker.x & 1 ^ plVar4[local_68.blocker.x >> 1].value) == bVar2 &&
                  bVar11 == 0 || (bVar11 & plVar4[local_68.blocker.x >> 1].value) != 0) {
                WVar7.blocker.x = local_68.blocker.x;
                WVar7.cref = uVar3;
                goto LAB_0010a227;
              }
            }
            bVar17 = 0x5f < *puVar1;
            local_58 = uVar9;
            local_54.x = local_68.blocker.x;
            local_38 = uVar8;
            if (bVar17) {
              uVar12 = (ulong)(*puVar1 >> 5);
              uVar8 = 3;
              do {
                uVar10 = puVar1[uVar8];
                if ((local_70->assigns).
                    super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.sz <=
                    (int)uVar10 >> 1) goto LAB_0010a4b8;
                if ((((byte)uVar10 & 1 ^ plVar4[(int)uVar10 >> 1].value) != l_False ||
                    (l_False & 2) != 0) && (plVar4[(int)uVar10 >> 1].value & l_False & 2) == 0) {
                  puVar1[2] = uVar10;
                  puVar1[uVar8] = uVar9;
                  if ((local_70->watches).occs.map.sz <= (int)((long)(int)puVar1[2] ^ 1U)) {
                    __assert_fail("has(k)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/mtl/IntMap.h"
                                  ,0x28,
                                  "V &Minisat::IntMap<Minisat::Lit, Minisat::vec<Minisat::Solver::Watcher>, Minisat::MkIndexLit>::operator[](K) [K = Minisat::Lit, V = Minisat::vec<Minisat::Solver::Watcher>, MkIndex = Minisat::MkIndexLit]"
                                 );
                  }
                  vec<Minisat::Solver::Watcher,_int>::push
                            ((local_50->occs).map.data + ((long)(int)puVar1[2] ^ 1U),&local_68);
                  this = local_70;
                  pWVar13 = local_48;
                  if (bVar17) goto LAB_0010a22e;
                  break;
                }
                bVar17 = uVar8 < uVar12;
                bVar18 = uVar8 != uVar12;
                uVar8 = uVar8 + 1;
              } while (bVar18);
            }
            pWVar13 = local_48;
            this = local_70;
            WVar5.blocker.x = local_68.blocker.x;
            WVar5.cref = local_68.cref;
            *pWVar16 = WVar5;
            if ((local_70->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>
                .map.sz <= local_54.x >> 1) {
LAB_0010a4b8:
              __assert_fail("has(k)",
                            "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/mtl/IntMap.h"
                            ,0x27,
                            "const V &Minisat::IntMap<int, Minisat::lbool>::operator[](K) const [K = int, V = Minisat::lbool, MkIndex = Minisat::MkIndexDefault<int>]"
                           );
            }
            pWVar16 = pWVar16 + 1;
            bVar2 = (local_70->assigns).
                    super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.data
                    [local_54.x >> 1].value;
            if (((byte)local_54.x & 1 ^ bVar2) == l_False && (l_False & 2) == 0 ||
                (bVar2 & l_False & 2) != 0) {
              local_70->qhead = (local_70->trail).sz;
              for (; local_78 = (CRef)local_38, pWVar15 < local_48; pWVar15 = pWVar15 + 1) {
                *pWVar16 = *pWVar15;
                pWVar16 = pWVar16 + 1;
              }
            }
            else {
              uncheckedEnqueue(local_70,local_54,(CRef)local_38);
            }
          }
          else {
            WVar7 = *pWVar14;
LAB_0010a227:
            pWVar15 = pWVar14 + 1;
            *pWVar16 = WVar7;
            pWVar16 = pWVar16 + 1;
          }
LAB_0010a22e:
          pWVar14 = pWVar15;
        } while (pWVar15 != pWVar13);
      }
      uVar10 = local_5c + 1;
      vec<Minisat::Solver::Watcher,_int>::shrink
                (local_40,(Size)((ulong)((long)pWVar15 - (long)pWVar16) >> 3));
      iVar6 = this->qhead;
    } while (iVar6 < (this->trail).sz);
    uVar8 = (ulong)uVar10;
  }
  else {
    local_78 = 0xffffffff;
  }
  this->propagations = this->propagations + uVar8;
  this->simpDB_props = this->simpDB_props - uVar8;
  return local_78;
}

Assistant:

CRef Solver::propagate()
{
    CRef    confl     = CRef_Undef;
    int     num_props = 0;

    while (qhead < trail.size()){
        Lit            p   = trail[qhead++];     // 'p' is enqueued fact to propagate.
        vec<Watcher>&  ws  = watches.lookup(p);
        Watcher        *i, *j, *end;
        num_props++;

        for (i = j = (Watcher*)ws, end = i + ws.size();  i != end;){
            // Try to avoid inspecting the clause:
            Lit blocker = i->blocker;
            if (value(blocker) == l_True){
                *j++ = *i++; continue; }

            // Make sure the false literal is data[1]:
            CRef     cr        = i->cref;
            Clause&  c         = ca[cr];
            Lit      false_lit = ~p;
            if (c[0] == false_lit)
                c[0] = c[1], c[1] = false_lit;
            assert(c[1] == false_lit);
            i++;

            // If 0th watch is true, then clause is already satisfied.
            Lit     first = c[0];
            Watcher w     = Watcher(cr, first);
            if (first != blocker && value(first) == l_True){
                *j++ = w; continue; }

            // Look for new watch:
            for (int k = 2; k < c.size(); k++)
                if (value(c[k]) != l_False){
                    c[1] = c[k]; c[k] = false_lit;
                    watches[~c[1]].push(w);
                    goto NextClause; }

            // Did not find watch -- clause is unit under assignment:
            *j++ = w;
            if (value(first) == l_False){
                confl = cr;
                qhead = trail.size();
                // Copy the remaining watches:
                while (i < end)
                    *j++ = *i++;
            }else
                uncheckedEnqueue(first, cr);

        NextClause:;
        }
        ws.shrink(i - j);
    }
    propagations += num_props;
    simpDB_props -= num_props;

    return confl;
}